

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O0

bool __thiscall CNetAddr::SetInternal(CNetAddr *this,string *name)

{
  bool bVar1;
  uchar *hash_00;
  prevector<16U,_unsigned_char,_unsigned_int,_int> *in_RSI;
  CSHA256 *in_RDI;
  long in_FS_OFFSET;
  uchar hash [32];
  CSHA256 *in_stack_ffffffffffffff38;
  CSHA256 *data;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  data = in_RDI;
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffff38);
  if (!bVar1) {
    in_RDI->s[6] = 6;
    memset(local_28,0,0x20);
    CSHA256::CSHA256(in_stack_ffffffffffffff38);
    hash_00 = (uchar *)std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffff38);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff38);
    CSHA256::Write((CSHA256 *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                   (uchar *)data,(size_t)in_RSI);
    CSHA256::Finalize(in_RDI,hash_00);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::assign<unsigned_char_*>
              (in_RSI,(uchar *)in_RDI,hash_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return !bVar1;
}

Assistant:

bool CNetAddr::SetInternal(const std::string &name)
{
    if (name.empty()) {
        return false;
    }
    m_net = NET_INTERNAL;
    unsigned char hash[32] = {};
    CSHA256().Write((const unsigned char*)name.data(), name.size()).Finalize(hash);
    m_addr.assign(hash, hash + ADDR_INTERNAL_SIZE);
    return true;
}